

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O1

void HN::parseJob(ItemData *data,Job *res)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  size_type sVar11;
  key_type local_98;
  Job *local_78;
  key_type local_70;
  string local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"by","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(data,&local_98);
  std::__cxx11::string::_M_assign((string *)res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"id","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  pcVar1 = (pmVar4->_M_dataplus)._M_p;
  piVar5 = __errno_location();
  iVar10 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(pcVar1,(char **)&local_70,10);
  if (local_70._M_dataplus._M_p == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_0010cb28:
    std::__throw_invalid_argument("stoi");
LAB_0010cb34:
    std::__throw_invalid_argument("stoll");
  }
  else if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
    if (*piVar5 == 0) {
      *piVar5 = iVar10;
    }
    res->id = (ItemId)lVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"score","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(data,&local_98);
    pcVar1 = (pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar10 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(pcVar1,(char **)&local_70,10);
    if (local_70._M_dataplus._M_p == pcVar1) goto LAB_0010cb28;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_0010cb4c;
    if (*piVar5 == 0) {
      *piVar5 = iVar10;
    }
    res->score = (int)lVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"time","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(data,&local_98);
    pcVar1 = (pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar10 = *piVar5;
    *piVar5 = 0;
    uVar7 = strtoll(pcVar1,(char **)&local_70,10);
    if (local_70._M_dataplus._M_p != pcVar1) {
      if (*piVar5 != 0) {
        if (*piVar5 != 0x22) goto LAB_0010c978;
        uVar7 = std::__throw_out_of_range("stoll");
      }
      *piVar5 = iVar10;
LAB_0010c978:
      res->time = uVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"title","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(data,&local_70);
      pcVar2 = (pmVar4->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pmVar4->_M_string_length);
      parseHTML(&local_98,&local_50);
      std::__cxx11::string::operator=((string *)&res->title,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_78 = res;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"url","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(data,&local_98);
      std::__cxx11::string::_M_assign((string *)&res->url);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&res->domain,0,(char *)(res->domain)._M_string_length,0x166c15);
      sVar3 = (res->url)._M_string_length;
      if (sVar3 == 0) {
        return;
      }
      pcVar2 = (local_78->url)._M_dataplus._M_p;
      sVar11 = 0;
      iVar10 = 0;
      while( true ) {
        if (pcVar2[sVar11] == '/') {
          iVar10 = iVar10 + 1;
          iVar9 = 3;
        }
        else {
          iVar9 = 2;
          if ((iVar10 < 3) && (iVar9 = 0, iVar10 == 2)) {
            std::__cxx11::string::push_back((char)&res->domain);
          }
        }
        if ((iVar9 != 3) && (iVar9 != 0)) break;
        sVar11 = sVar11 + 1;
        if (sVar3 == sVar11) {
          return;
        }
      }
      return;
    }
    goto LAB_0010cb34;
  }
  std::__throw_out_of_range("stoi");
LAB_0010cb4c:
  uVar8 = std::__throw_out_of_range("stoi");
  __cxa_begin_catch(uVar8);
  std::__cxx11::string::operator=((string *)((long)local_78 + 0x50),"");
  std::__cxx11::string::operator=((string *)((long)local_78 + 0x70),"");
  __cxa_end_catch();
  return;
}

Assistant:

void parseJob(const ItemData & data, Job & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.title = parseHTML(data.at("title"));
        } catch (...) {
            res.title = "";
        }
        try {
            res.url = data.at("url");
            res.domain = "";
            int slash = 0;
            for (auto & ch : res.url) {
                if (ch == '/') {
                    ++slash;
                    continue;
                }
                if (slash > 2) break;
                if (slash > 1) res.domain += ch;
            }
        } catch (...) {
            res.url = "";
            res.domain = "";
        }
    }